

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O0

void __thiscall
soplex::SPxSolverBase<double>::setLeaveBound4Row(SPxSolverBase<double> *this,int i,int n)

{
  double dVar1;
  Status *pSVar2;
  double *pdVar3;
  SPxLPBase<double> *this_00;
  long in_RDI;
  int in_stack_ffffffffffffff8c;
  SPxLPBase<double> *in_stack_ffffffffffffff90;
  
  SPxBasisBase<double>::desc((SPxBasisBase<double> *)(in_RDI + 0x1c8));
  pSVar2 = SPxBasisBase<double>::Desc::rowStatus
                     ((Desc *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  switch(*pSVar2) {
  case P_FIXED:
    pdVar3 = (double *)infinity();
    dVar1 = *pdVar3;
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    *pdVar3 = -dVar1;
    pdVar3 = (double *)infinity();
    dVar1 = *pdVar3;
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    *pdVar3 = dVar1;
    break;
  default:
    pdVar3 = SPxLPBase<double>::rhs(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    this_00 = (SPxLPBase<double> *)((ulong)*pdVar3 ^ 0x8000000000000000);
    pdVar3 = VectorBase<double>::operator[]((VectorBase<double> *)this_00,in_stack_ffffffffffffff8c)
    ;
    *pdVar3 = (double)this_00;
    pdVar3 = SPxLPBase<double>::lhs(this_00,in_stack_ffffffffffffff8c);
    dVar1 = *pdVar3;
    pdVar3 = VectorBase<double>::operator[]((VectorBase<double> *)this_00,in_stack_ffffffffffffff8c)
    ;
    *pdVar3 = -dVar1;
    break;
  case P_ON_LOWER:
    pdVar3 = (double *)infinity();
    dVar1 = *pdVar3;
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    *pdVar3 = -dVar1;
    pdVar3 = SPxLPBase<double>::maxRowObj(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    dVar1 = *pdVar3;
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    *pdVar3 = -dVar1;
    break;
  case P_ON_UPPER:
    pdVar3 = SPxLPBase<double>::maxRowObj(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    dVar1 = *pdVar3;
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    *pdVar3 = -dVar1;
    pdVar3 = (double *)infinity();
    dVar1 = *pdVar3;
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    *pdVar3 = dVar1;
    break;
  case P_FREE:
    pdVar3 = SPxLPBase<double>::maxRowObj(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    dVar1 = *pdVar3;
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    *pdVar3 = -dVar1;
    pdVar3 = SPxLPBase<double>::maxRowObj(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    dVar1 = *pdVar3;
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    *pdVar3 = -dVar1;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::setLeaveBound4Row(int i, int n)
{
   assert(this->baseId(i).isSPxRowId());
   assert(this->number(SPxRowId(this->baseId(i))) == n);

   switch(this->desc().rowStatus(n))
   {
   case SPxBasisBase<R>::Desc::P_ON_LOWER :
      theLBbound[i] = R(-infinity);
      theUBbound[i] = -this->maxRowObj(n);
      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER :
      theLBbound[i] = -this->maxRowObj(n);
      theUBbound[i] = R(infinity);
      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER + SPxBasisBase<R>::Desc::P_ON_LOWER :
      theLBbound[i] = R(-infinity);
      theUBbound[i] = R(infinity);
      break;

   case SPxBasisBase<R>::Desc::P_FREE :
      theLBbound[i] = -this->maxRowObj(n);
      theUBbound[i] = -this->maxRowObj(n);
      break;

   default:
      assert(rep() == COLUMN);
      theLBbound[i] = -this->rhs(n);                // slacks !
      theUBbound[i] = -this->lhs(n);                // slacks !
      break;
   }
}